

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

void duckdb::CheckOnConflictCondition
               (ExecutionContext *context,DataChunk *conflicts,
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               *condition,DataChunk *result)

{
  ClientContext *pCVar1;
  type expression;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_99;
  LogicalType local_98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  ExpressionExecutor executor;
  
  pCVar1 = context->client;
  expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(condition);
  ExpressionExecutor::ExpressionExecutor(&executor,pCVar1,expression);
  pCVar1 = context->client;
  LogicalType::LogicalType(&local_98,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = &local_98;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,__l,&local_99);
  DataChunk::Initialize(result,pCVar1,(vector<duckdb::LogicalType,_true> *)&local_80,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  LogicalType::~LogicalType(&local_98);
  ExpressionExecutor::Execute(&executor,conflicts,result);
  result->count = conflicts->count;
  ExpressionExecutor::~ExpressionExecutor(&executor);
  return;
}

Assistant:

void CheckOnConflictCondition(ExecutionContext &context, DataChunk &conflicts, const unique_ptr<Expression> &condition,
                              DataChunk &result) {
	ExpressionExecutor executor(context.client, *condition);
	result.Initialize(context.client, {LogicalType::BOOLEAN});
	executor.Execute(conflicts, result);
	result.SetCardinality(conflicts.size());
}